

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O3

Vector3d * __thiscall
OpenMD::HydroProp::getCenterOfPitch(Vector3d *__return_storage_ptr__,HydroProp *this)

{
  uint i;
  long lVar1;
  Vector<double,_3U> result;
  Mat3x3d P;
  double local_98 [4];
  double local_78 [3];
  Mat3x3d local_60;
  
  getPitchMatrix(&local_60,this);
  local_78[0] = (local_60.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2]
                - local_60.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [1]) * 0.5;
  local_78[1] = (local_60.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0]
                - local_60.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [2]) * 0.5;
  local_78[2] = (local_60.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
                - local_60.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                  [0]) * 0.5;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  lVar1 = 0;
  do {
    local_98[lVar1] = (this->cor_).super_Vector<double,_3U>.data_[lVar1] + local_78[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = local_98[2];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = local_98[0];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = local_98[1];
  return __return_storage_ptr__;
}

Assistant:

Vector3d HydroProp::getCenterOfPitch() {
    Mat3x3d P = getPitchMatrix();
    Vector3d cop;
    cop[0] = 0.5 * (P(1, 2) - P(2, 1));
    cop[1] = 0.5 * (P(2, 0) - P(0, 2));
    cop[2] = 0.5 * (P(0, 1) - P(1, 0));
    // Assume Xi_ was stored at center of resistance, so center of
    // pitch is returned relative to origin if center of resistance is
    // not the origin:
    return (cor_ + cop);
  }